

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct32_stage8_avx2(__m256i *bf1,__m256i *cospim32,__m256i *cospi32,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rounding,int bit)

{
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i *in_RCX;
  __m256i *in_RDX;
  __m256i *in_RSI;
  __m256i *in_RDI;
  __m256i *in_R8;
  __m256i *in_R9;
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  __m256i temp1;
  __m256i *in_stack_ffffffffffffff98;
  int bit_00;
  __m256i *in_stack_ffffffffffffffd0;
  __m256i in_stack_ffffffffffffffd8;
  
  in1[1] = (longlong)in_RSI;
  in1[0] = (longlong)in_RDX;
  in1[2] = (longlong)in_RDI;
  in1[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_00[1] = (longlong)in_RSI;
  in1_00[0] = (longlong)in_RDX;
  in1_00[2] = (longlong)in_RDI;
  in1_00[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_00,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_01[1] = (longlong)in_RSI;
  in1_01[0] = (longlong)in_RDX;
  in1_01[2] = (longlong)in_RDI;
  in1_01[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_01,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_02[1] = (longlong)in_RSI;
  in1_02[0] = (longlong)in_RDX;
  in1_02[2] = (longlong)in_RDI;
  in1_02[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_02,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_03[1] = (longlong)in_RSI;
  in1_03[0] = (longlong)in_RDX;
  in1_03[2] = (longlong)in_RDI;
  in1_03[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_03,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_04[1] = (longlong)in_RSI;
  in1_04[0] = (longlong)in_RDX;
  in1_04[2] = (longlong)in_RDI;
  in1_04[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_04,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_05[1] = (longlong)in_RSI;
  in1_05[0] = (longlong)in_RDX;
  in1_05[2] = (longlong)in_RDI;
  in1_05[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_05,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  lVar1 = in_RDI[7][0];
  lVar3 = in_RDI[7][1];
  lVar5 = in_RDI[7][2];
  lVar7 = in_RDI[7][3];
  in1_06[1] = (longlong)in_RSI;
  in1_06[0] = (longlong)in_RDX;
  in1_06[2] = (longlong)in_RDI;
  in1_06[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_06,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  bit_00 = (int)((ulong)in_R8 >> 0x20);
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar2 = lVar1;
  lVar4 = lVar3;
  lVar6 = lVar5;
  lVar8 = lVar7;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x1b][0] = lVar2;
  in_RDI[0x1b][1] = lVar4;
  in_RDI[0x1b][2] = lVar6;
  in_RDI[0x1b][3] = lVar7;
  in_RDI[0x14][0] = lVar1;
  in_RDI[0x14][1] = lVar3;
  in_RDI[0x14][2] = lVar5;
  in_RDI[0x14][3] = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar7 = lVar1;
  lVar2 = lVar3;
  lVar4 = lVar5;
  lVar6 = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x1a][0] = lVar7;
  in_RDI[0x1a][1] = lVar2;
  in_RDI[0x1a][2] = lVar4;
  in_RDI[0x1a][3] = lVar6;
  in_RDI[0x15][0] = lVar1;
  in_RDI[0x15][1] = lVar3;
  in_RDI[0x15][2] = lVar5;
  in_RDI[0x15][3] = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar7 = lVar1;
  lVar2 = lVar3;
  lVar4 = lVar5;
  lVar9 = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x19][0] = lVar7;
  in_RDI[0x19][1] = lVar2;
  in_RDI[0x19][2] = lVar4;
  in_RDI[0x19][3] = lVar8;
  in_RDI[0x16][0] = lVar1;
  in_RDI[0x16][1] = lVar3;
  in_RDI[0x16][2] = lVar5;
  in_RDI[0x16][3] = lVar9;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar7 = lVar1;
  lVar2 = lVar3;
  lVar4 = lVar5;
  lVar6 = lVar9;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x18][0] = lVar7;
  in_RDI[0x18][1] = lVar2;
  in_RDI[0x18][2] = lVar4;
  in_RDI[0x18][3] = lVar6;
  in_RDI[0x17][0] = lVar1;
  in_RDI[0x17][1] = lVar3;
  in_RDI[0x17][2] = lVar5;
  in_RDI[0x17][3] = lVar9;
  return;
}

Assistant:

static inline void idct32_stage8_avx2(__m256i *bf1, const __m256i *cospim32,
                                      const __m256i *cospi32,
                                      const __m256i *clamp_lo,
                                      const __m256i *clamp_hi,
                                      const __m256i *rounding, int bit) {
  __m256i temp1, temp2;
  addsub_avx2(bf1[0], bf1[15], bf1 + 0, bf1 + 15, clamp_lo, clamp_hi);
  addsub_avx2(bf1[1], bf1[14], bf1 + 1, bf1 + 14, clamp_lo, clamp_hi);
  addsub_avx2(bf1[2], bf1[13], bf1 + 2, bf1 + 13, clamp_lo, clamp_hi);
  addsub_avx2(bf1[3], bf1[12], bf1 + 3, bf1 + 12, clamp_lo, clamp_hi);
  addsub_avx2(bf1[4], bf1[11], bf1 + 4, bf1 + 11, clamp_lo, clamp_hi);
  addsub_avx2(bf1[5], bf1[10], bf1 + 5, bf1 + 10, clamp_lo, clamp_hi);
  addsub_avx2(bf1[6], bf1[9], bf1 + 6, bf1 + 9, clamp_lo, clamp_hi);
  addsub_avx2(bf1[7], bf1[8], bf1 + 7, bf1 + 8, clamp_lo, clamp_hi);

  temp1 = half_btf_avx2(cospim32, &bf1[20], cospi32, &bf1[27], rounding, bit);
  bf1[27] = half_btf_avx2(cospi32, &bf1[20], cospi32, &bf1[27], rounding, bit);
  bf1[20] = temp1;
  temp2 = half_btf_avx2(cospim32, &bf1[21], cospi32, &bf1[26], rounding, bit);
  bf1[26] = half_btf_avx2(cospi32, &bf1[21], cospi32, &bf1[26], rounding, bit);
  bf1[21] = temp2;
  temp1 = half_btf_avx2(cospim32, &bf1[22], cospi32, &bf1[25], rounding, bit);
  bf1[25] = half_btf_avx2(cospi32, &bf1[22], cospi32, &bf1[25], rounding, bit);
  bf1[22] = temp1;
  temp2 = half_btf_avx2(cospim32, &bf1[23], cospi32, &bf1[24], rounding, bit);
  bf1[24] = half_btf_avx2(cospi32, &bf1[23], cospi32, &bf1[24], rounding, bit);
  bf1[23] = temp2;
}